

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::BitXorFun::GetFunctions(void)

{
  AggregateFunction *this;
  InternalException *this_00;
  LogicalType *in_RCX;
  AggregateFunctionSet *in_RDI;
  FunctionNullHandling in_R8B;
  vector<duckdb::AggregateFunction,_true> *this_01;
  pointer other;
  allocator local_319;
  string local_318;
  AggregateFunctionSet *local_2f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2f0;
  LogicalType local_2d8;
  undefined1 local_2c0 [48];
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  local_2f8 = in_RDI;
  LogicalType::Integral();
  this_01 = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  this = (AggregateFunction *)(local_2c0 + 0x18);
  other = local_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (other == local_2f0.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2f0);
      LogicalType::LogicalType((LogicalType *)local_2c0,BIT);
      LogicalType::LogicalType(&local_2d8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::BitStringXorOperation,(duckdb::AggregateDestructorType)0>
                (&local_290,(AggregateFunction *)local_2c0,&local_2d8,in_RCX);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&this_01->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_290);
      AggregateFunction::~AggregateFunction(&local_290);
      LogicalType::~LogicalType(&local_2d8);
      LogicalType::~LogicalType((LogicalType *)local_2c0);
      return local_2f8;
    }
    LogicalType::LogicalType((LogicalType *)this,other);
    switch(local_2c0[0x18]) {
    case 0xb:
      LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
      in_RCX = (LogicalType *)0x0;
      AggregateFunction::
      UnaryAggregate<duckdb::BitState<unsigned_char>,signed_char,signed_char,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
      break;
    case 0xc:
      LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
      in_RCX = (LogicalType *)0x0;
      AggregateFunction::
      UnaryAggregate<duckdb::BitState<unsigned_short>,short,short,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
      break;
    case 0xd:
      LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
      in_RCX = (LogicalType *)0x0;
      AggregateFunction::
      UnaryAggregate<duckdb::BitState<unsigned_int>,int,int,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
      break;
    case 0xe:
      LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
      in_RCX = (LogicalType *)0x0;
      AggregateFunction::
      UnaryAggregate<duckdb::BitState<unsigned_long>,long,long,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
      break;
    default:
      switch(local_2c0[0x18]) {
      case 0x1c:
        LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
        in_RCX = (LogicalType *)0x0;
        AggregateFunction::
        UnaryAggregate<duckdb::BitState<unsigned_char>,unsigned_char,unsigned_char,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                  (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
        break;
      case 0x1d:
        LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
        in_RCX = (LogicalType *)0x0;
        AggregateFunction::
        UnaryAggregate<duckdb::BitState<unsigned_short>,unsigned_short,unsigned_short,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                  (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
        break;
      case 0x1e:
        LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
        in_RCX = (LogicalType *)0x0;
        AggregateFunction::
        UnaryAggregate<duckdb::BitState<unsigned_int>,unsigned_int,unsigned_int,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                  (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
        break;
      case 0x1f:
        LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
        in_RCX = (LogicalType *)0x0;
        AggregateFunction::
        UnaryAggregate<duckdb::BitState<unsigned_long>,unsigned_long,unsigned_long,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                  (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
        break;
      default:
        if (local_2c0[0x18] == '1') {
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
        }
        else {
          if (local_2c0[0x18] != '2') {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_318,"Unimplemented bitfield type for unary aggregate",
                       &local_319);
            InternalException::InternalException(this_00,&local_318);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
        }
      }
    }
    LogicalType::~LogicalType((LogicalType *)&local_318);
    ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&this_01->
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_160);
    AggregateFunction::~AggregateFunction(&local_160);
    LogicalType::~LogicalType((LogicalType *)this);
    other = other + 1;
  } while( true );
}

Assistant:

AggregateFunctionSet BitXorFun::GetFunctions() {
	AggregateFunctionSet bit_xor;
	for (auto &type : LogicalType::Integral()) {
		bit_xor.AddFunction(GetBitfieldUnaryAggregate<BitXorOperation>(type));
	}
	bit_xor.AddFunction(
	    AggregateFunction::UnaryAggregateDestructor<BitState<string_t>, string_t, string_t, BitStringXorOperation>(
	        LogicalType::BIT, LogicalType::BIT));
	return bit_xor;
}